

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetachedCoroutine.h
# Opt level: O3

void __thiscall
async_simple::coro::detail::DetachedCoroutine::promise_type::unhandled_exception(promise_type *this)

{
  FILE *__stream;
  long *plVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  long local_20;
  long local_18;
  
  std::current_exception();
  auVar3 = std::rethrow_exception((exception_ptr)&local_18);
  uVar2 = auVar3._0_8_;
  if (local_18 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (auVar3._8_4_ == 1) {
    plVar1 = (long *)__cxa_begin_catch(uVar2);
    __stream = _stderr;
    uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
    fprintf(__stream,"find exception %s\n",uVar2);
    fflush(_stderr);
    std::current_exception();
    uVar2 = std::rethrow_exception((exception_ptr)&local_20);
    if (local_20 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    __cxa_end_catch();
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void unhandled_exception() {
            try {
                std::rethrow_exception(std::current_exception());
            } catch (const std::exception& e) {
                fprintf(stderr, "find exception %s\n", e.what());
                fflush(stderr);
                std::rethrow_exception(std::current_exception());
            }
        }